

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O2

uint32 __thiscall
Wasm::WasmSignature::WriteSignatureToString(WasmSignature *this,char16 *out,uint32 maxlen)

{
  WCHAR *_Dst;
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Local LVar7;
  uint32 uVar8;
  undefined4 *puVar9;
  char16 *pcVar10;
  long lVar11;
  uint32 i_1;
  uint uVar12;
  ulong _SizeInWords;
  ArgSlot i;
  ArgSlot index;
  
  uVar12 = this->m_resultsCount;
  uVar4 = (uint)(1 < uVar12) * 8 + 0xc;
  if (maxlen <= uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                       ,0xf4,"(maxlen > minEnd)","maxlen > minEnd");
    if (!bVar3) goto LAB_00d7610a;
    *puVar9 = 0;
  }
  if (out == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                       ,0xf5,"(out != nullptr)","out != nullptr");
    if (!bVar3) {
LAB_00d7610a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
  }
  uVar5 = _snwprintf_unsafe(out,(ulong)maxlen,0xffffffffffffffff,L"(");
  for (index = 0; index < this->m_paramsCount; index = index + 1) {
    if (index != 0) {
      iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L", ");
      uVar5 = uVar5 + iVar6;
    }
    LVar7 = GetParam(this,index);
    pcVar10 = WasmTypes::GetTypeName(LVar7);
    iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L"%ls",pcVar10)
    ;
    uVar5 = uVar5 + iVar6;
  }
  if (uVar5 < maxlen - uVar4) {
LAB_00d75fd5:
    _Dst = out + uVar5;
    _SizeInWords = (ulong)(maxlen - uVar5);
    if (this->m_resultsCount == 1) {
      LVar7 = GetResult(this,0);
      pcVar10 = WasmTypes::GetTypeName(LVar7);
      iVar6 = _snwprintf_unsafe(_Dst,_SizeInWords,0xffffffffffffffff,L")->%ls",pcVar10);
    }
    else {
      if (this->m_resultsCount != 0) {
        iVar6 = _snwprintf_unsafe(_Dst,_SizeInWords,0xffffffffffffffff,L")->(");
        uVar5 = iVar6 + uVar5;
        for (uVar12 = 0; uVar12 < this->m_resultsCount; uVar12 = uVar12 + 1) {
          if (uVar12 != 0) {
            iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L", ");
            uVar5 = uVar5 + iVar6;
          }
          LVar7 = GetResult(this,uVar12);
          pcVar10 = WasmTypes::GetTypeName(LVar7);
          iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L"%ls",
                                    pcVar10);
          uVar5 = uVar5 + iVar6;
        }
        iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L")");
        goto LAB_00d760f8;
      }
      iVar6 = _snwprintf_unsafe(_Dst,_SizeInWords,0xffffffffffffffff,L")->void");
    }
    uVar8 = iVar6 + uVar5;
  }
  else {
    for (lVar11 = 0; -lVar11 != (ulong)uVar4; lVar11 = lVar11 + -1) {
      out[(ulong)maxlen + lVar11 + -1] = L'\0';
    }
    uVar2 = uVar5 - uVar4;
    if (uVar5 < uVar4) {
      uVar2 = 0;
    }
    iVar6 = _snwprintf_unsafe(out + uVar2,(ulong)(maxlen - uVar2),0xffffffffffffffff,L"...");
    uVar5 = iVar6 + uVar2;
    if (uVar12 < 2) goto LAB_00d75fd5;
    LVar7 = GetResult(this,0);
    pcVar10 = WasmTypes::GetTypeName(LVar7);
    iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L")->(%s, ...)"
                              ,pcVar10);
LAB_00d760f8:
    uVar8 = iVar6 + uVar5;
  }
  return uVar8;
}

Assistant:

uint32 WasmSignature::WriteSignatureToString(_Out_writes_(maxlen) char16* out, uint32 maxlen)
{
    bool hasMultiResults = GetResultCount() > 1;
    const uint32 minEnd = GetResultCount() > 1 ? 20 : 12;
    AssertOrFailFast(maxlen > minEnd);
    AssertOrFailFast(out != nullptr);
    uint32 numwritten = 0;
#define WRITE_BUF(msg, ...) numwritten += _snwprintf_s(out+numwritten, maxlen-numwritten, _TRUNCATE, msg, ##__VA_ARGS__);
    WRITE_BUF(_u("("));
    for (Js::ArgSlot i = 0; i < GetParamCount(); i++)
    {
        if (i != 0)
        {
            WRITE_BUF(_u(", "));
        }
        WRITE_BUF(_u("%ls"), WasmTypes::GetTypeName(this->GetParam(i)));
    }
    if (numwritten >= maxlen - minEnd) {
        // null out the last 12 characters so we can properly end it 
        for (uint32 i = 1; i <= minEnd; i++)
        {
            *(out + maxlen - i) = 0;
        }
        if (numwritten < minEnd)
        {
            numwritten = 0;
        }
        else
        {
            numwritten -= minEnd;
        }

        WRITE_BUF(_u("..."));
        if (hasMultiResults)
        {
            // If the signature has multiple results, just print the first one then terminate.
            WRITE_BUF(_u(")->(%s, ...)"), WasmTypes::GetTypeName(this->GetResult(0)));
            return numwritten;
        }
    }
    if (GetResultCount() == 0)
    {
        WRITE_BUF(_u(")->void"));
    }
    else if (GetResultCount() == 1)
    {
        WRITE_BUF(_u(")->%ls"), WasmTypes::GetTypeName(this->GetResult(0)));
    }
    else
    {
        WRITE_BUF(_u(")->("));
        for (uint32 i = 0; i < GetResultCount(); i++)
        {
            if (i != 0)
            {
                WRITE_BUF(_u(", "));
            }
            WRITE_BUF(_u("%ls"), WasmTypes::GetTypeName(this->GetResult(i)));
        }
        WRITE_BUF(_u(")"));
    }
#undef WRITE_BUF
    return numwritten;
}